

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O3

void __thiscall
cmELFInternalImpl<cmELFTypes64>::ByteSwap(cmELFInternalImpl<cmELFTypes64> *this,ELF_Dyn *dyn)

{
  ELF_Dyn EVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [11];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [11];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar30 [15];
  
  EVar1 = *dyn;
  auVar32[8] = EVar1.d_un._0_1_;
  auVar32[9] = 0;
  auVar32[10] = EVar1.d_un._1_1_;
  auVar29._0_10_ = (unkuint10)EVar1.d_un._4_1_ << 0x40;
  auVar29[10] = EVar1.d_un._5_1_;
  auVar30[0xb] = 0;
  auVar30._0_11_ = auVar29;
  auVar30[0xc] = EVar1.d_un._6_1_;
  auVar30[0xd] = 0;
  auVar30[0xe] = EVar1.d_un._7_1_;
  auVar32[3] = 0;
  auVar32._0_3_ = auVar29._8_3_;
  auVar32._4_3_ = auVar30._12_3_;
  auVar32[7] = 0;
  auVar32[0xb] = 0;
  auVar32._12_3_ = (int3)(CONCAT16(EVar1.d_un._3_1_,(uint6)EVar1.d_un._2_1_ << 0x20) >> 0x20);
  auVar32[0xf] = 0;
  auVar31 = pshuflw(auVar32,auVar32,0x1b);
  auVar32 = pshufhw(auVar31,auVar31,0x1b);
  auVar18[0xd] = 0;
  auVar18._0_13_ = EVar1._0_13_;
  auVar18[0xe] = EVar1.d_tag._7_1_;
  auVar19[0xc] = EVar1.d_tag._6_1_;
  auVar19._0_12_ = EVar1._0_12_;
  auVar19._13_2_ = auVar18._13_2_;
  auVar20[0xb] = 0;
  auVar20._0_11_ = EVar1._0_11_;
  auVar20._12_3_ = auVar19._12_3_;
  auVar21[10] = EVar1.d_tag._5_1_;
  auVar21._0_10_ = EVar1._0_10_;
  auVar21._11_4_ = auVar20._11_4_;
  auVar22[9] = 0;
  auVar22._0_9_ = EVar1._0_9_;
  auVar22._10_5_ = auVar21._10_5_;
  auVar23[8] = EVar1.d_tag._4_1_;
  auVar23._0_8_ = EVar1.d_tag;
  auVar23._9_6_ = auVar22._9_6_;
  auVar31[7] = 0;
  auVar31._0_7_ = auVar23._8_7_;
  auVar25._7_8_ = 0;
  auVar25._0_7_ = auVar23._8_7_;
  auVar27._1_8_ = SUB158(auVar25 << 0x40,7);
  auVar27[0] = EVar1.d_tag._3_1_;
  auVar27._9_6_ = 0;
  auVar26._1_10_ = SUB1510(auVar27 << 0x30,5);
  auVar26[0] = EVar1.d_tag._2_1_;
  auVar28._11_4_ = 0;
  auVar28._0_11_ = auVar26;
  auVar24._3_12_ = SUB1512(auVar28 << 0x20,3);
  auVar24[2] = EVar1.d_tag._1_1_;
  auVar24[1] = 0;
  auVar24[0] = (byte)EVar1.d_tag;
  auVar31._8_4_ = auVar24._0_4_;
  auVar31._12_4_ = auVar26._0_4_;
  auVar31 = pshuflw(auVar31,auVar31,0x1b);
  auVar31 = pshufhw(auVar31,auVar31,0x1b);
  sVar2 = auVar31._0_2_;
  sVar3 = auVar31._2_2_;
  sVar4 = auVar31._4_2_;
  sVar5 = auVar31._6_2_;
  sVar6 = auVar31._8_2_;
  sVar7 = auVar31._10_2_;
  sVar8 = auVar31._12_2_;
  sVar9 = auVar31._14_2_;
  sVar10 = auVar32._0_2_;
  sVar11 = auVar32._2_2_;
  sVar12 = auVar32._4_2_;
  sVar13 = auVar32._6_2_;
  sVar14 = auVar32._8_2_;
  sVar15 = auVar32._10_2_;
  sVar16 = auVar32._12_2_;
  sVar17 = auVar32._14_2_;
  *(char *)&dyn->d_tag = (0 < sVar2) * (sVar2 < 0x100) * auVar31[0] - (0xff < sVar2);
  *(char *)((long)&dyn->d_tag + 1) = (0 < sVar3) * (sVar3 < 0x100) * auVar31[2] - (0xff < sVar3);
  *(char *)((long)&dyn->d_tag + 2) = (0 < sVar4) * (sVar4 < 0x100) * auVar31[4] - (0xff < sVar4);
  *(char *)((long)&dyn->d_tag + 3) = (0 < sVar5) * (sVar5 < 0x100) * auVar31[6] - (0xff < sVar5);
  *(char *)((long)&dyn->d_tag + 4) = (0 < sVar6) * (sVar6 < 0x100) * auVar31[8] - (0xff < sVar6);
  *(char *)((long)&dyn->d_tag + 5) = (0 < sVar7) * (sVar7 < 0x100) * auVar31[10] - (0xff < sVar7);
  *(char *)((long)&dyn->d_tag + 6) = (0 < sVar8) * (sVar8 < 0x100) * auVar31[0xc] - (0xff < sVar8);
  *(char *)((long)&dyn->d_tag + 7) = (0 < sVar9) * (sVar9 < 0x100) * auVar31[0xe] - (0xff < sVar9);
  *(char *)&dyn->d_un = (0 < sVar10) * (sVar10 < 0x100) * auVar32[0] - (0xff < sVar10);
  *(char *)((long)&dyn->d_un + 1) = (0 < sVar11) * (sVar11 < 0x100) * auVar32[2] - (0xff < sVar11);
  *(char *)((long)&dyn->d_un + 2) = (0 < sVar12) * (sVar12 < 0x100) * auVar32[4] - (0xff < sVar12);
  *(char *)((long)&dyn->d_un + 3) = (0 < sVar13) * (sVar13 < 0x100) * auVar32[6] - (0xff < sVar13);
  *(char *)((long)&dyn->d_un + 4) = (0 < sVar14) * (sVar14 < 0x100) * auVar32[8] - (0xff < sVar14);
  *(char *)((long)&dyn->d_un + 5) = (0 < sVar15) * (sVar15 < 0x100) * auVar32[10] - (0xff < sVar15);
  *(char *)((long)&dyn->d_un + 6) = (0 < sVar16) * (sVar16 < 0x100) * auVar32[0xc] - (0xff < sVar16)
  ;
  *(char *)((long)&dyn->d_un + 7) = (0 < sVar17) * (sVar17 < 0x100) * auVar32[0xe] - (0xff < sVar17)
  ;
  return;
}

Assistant:

static void cmELFByteSwap(char* data, cmELFByteSwapSize<8> /*unused*/)
{
  char one_byte;
  one_byte = data[0];
  data[0] = data[7];
  data[7] = one_byte;
  one_byte = data[1];
  data[1] = data[6];
  data[6] = one_byte;
  one_byte = data[2];
  data[2] = data[5];
  data[5] = one_byte;
  one_byte = data[3];
  data[3] = data[4];
  data[4] = one_byte;
}